

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_trie.hpp
# Opt level: O0

void __thiscall
poplar::
compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::show_stats(compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *this,ostream *os,int n)

{
  uint32_t uVar1;
  uint64_t uVar2;
  undefined4 in_EDX;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_RSI;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_RDI;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  string indent;
  string *in_stack_ffffffffffffff38;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_ffffffffffffff40;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *os_00;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  ostream *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff68;
  int n_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar5;
  split_mix_hasher *this_00;
  string local_38 [12];
  int in_stack_ffffffffffffffd4;
  ostream *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *this_01;
  
  auVar4 = in_ZMM1._0_16_;
  auVar3 = in_ZMM0._0_16_;
  get_indent_abi_cxx11_((int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  show_stat<char[20]>(in_stack_ffffffffffffff50,
                      (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      (char *)in_stack_ffffffffffffff40,(char (*) [20])in_stack_ffffffffffffff38);
  uVar2 = size(in_RDI);
  auVar3 = vcvtusi2sd_avx512f(auVar3,uVar2);
  uVar2 = capa_size((compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                     *)0x2281e3);
  auVar4 = vcvtusi2sd_avx512f(auVar4,uVar2);
  this_00 = (split_mix_hasher *)((auVar3._0_8_ / auVar4._0_8_) * 100.0);
  show_stat<double>(in_stack_ffffffffffffff50,
                    (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                    (char *)in_stack_ffffffffffffff40,(double *)in_stack_ffffffffffffff38);
  uVar5 = 0x5a;
  show_stat<unsigned_int>
            (in_stack_ffffffffffffff50,
             (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (char *)in_stack_ffffffffffffff40,(uint *)in_stack_ffffffffffffff38);
  uVar2 = size(in_RDI);
  n_00 = (int)(uVar2 >> 0x20);
  show_stat<unsigned_long>
            (in_stack_ffffffffffffff50,
             (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (char *)in_stack_ffffffffffffff40,(unsigned_long *)in_stack_ffffffffffffff38);
  alloc_bytes(in_stack_ffffffffffffff40);
  show_stat<unsigned_long>
            (in_stack_ffffffffffffff50,
             (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (char *)in_stack_ffffffffffffff40,(unsigned_long *)in_stack_ffffffffffffff38);
  os_00 = in_RSI;
  capa_bits((compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *)0x2282eb);
  show_stat<unsigned_int>
            ((ostream *)in_RSI,
             (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (char *)in_stack_ffffffffffffff40,(uint *)in_stack_ffffffffffffff38);
  this_01 = os_00;
  uVar1 = symb_bits((compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                     *)0x228326);
  show_stat<unsigned_int>
            ((ostream *)in_RSI,(string *)CONCAT44(uVar1,in_stack_ffffffffffffff48),(char *)os_00,
             (uint *)in_stack_ffffffffffffff38);
  show_stat<unsigned_int>
            ((ostream *)in_RSI,(string *)CONCAT44(uVar1,in_stack_ffffffffffffff48),(char *)os_00,
             (uint *)in_stack_ffffffffffffff38);
  show_stat<unsigned_int>
            ((ostream *)in_RSI,(string *)CONCAT44(uVar1,in_stack_ffffffffffffff48),(char *)os_00,
             (uint *)in_stack_ffffffffffffff38);
  show_member((ostream *)os_00,in_stack_ffffffffffffff38,(char *)0x2283ba);
  bijective_hash::split_mix_hasher::show_stats
            (this_00,(ostream *)CONCAT44(uVar5,in_stack_ffffffffffffffa8),n_00);
  show_member((ostream *)os_00,in_stack_ffffffffffffff38,(char *)0x2283f5);
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::show_stats
            ((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
             ,in_stack_ffffffffffffffd4);
  show_member((ostream *)os_00,in_stack_ffffffffffffff38,(char *)0x228434);
  standard_hash_table<80U,_poplar::hash::vigna_hasher>::show_stats
            (this_01,(ostream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4
            );
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "compact_fkhash_trie");
        show_stat(os, indent, "factor", double(size()) / capa_size() * 100);
        show_stat(os, indent, "max_factor", MaxFactor);
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
        show_stat(os, indent, "capa_bits", capa_bits());
        show_stat(os, indent, "symb_bits", symb_bits());
        show_stat(os, indent, "dsp1st_bits", dsp1_bits);
        show_stat(os, indent, "dsp2nd_bits", dsp2_bits);
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "rate_dsp1st", double(num_dsps_[0]) / size());
        show_stat(os, indent, "rate_dsp2nd", double(num_dsps_[1]) / size());
        show_stat(os, indent, "rate_dsp3rd", double(num_dsps_[2]) / size());
        show_stat(os, indent, "num_resize", num_resize_);
#endif
        show_member(os, indent, "hasher_");
        hasher_.show_stats(os, n + 1);
        show_member(os, indent, "aux_cht_");
        aux_cht_.show_stats(os, n + 1);
        show_member(os, indent, "aux_map_");
        aux_map_.show_stats(os, n + 1);
    }